

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pembase64.c
# Opt level: O1

int ptls_base64_decode(char *text,ptls_base64_decode_state_t *state,ptls_buffer_t *buf)

{
  char cVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  bool bVar4;
  int iVar5;
  byte bVar6;
  size_t len;
  uint uVar7;
  ulong uVar8;
  long lVar9;
  char *pcVar10;
  int iVar12;
  undefined1 auVar11 [16];
  int iVar13;
  undefined1 auVar14 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  int iVar22;
  int iVar27;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  int iVar28;
  int iVar31;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 in_XMM12 [16];
  undefined1 auVar32 [16];
  undefined1 in_XMM13 [16];
  uint8_t decoded [3];
  undefined1 local_33 [3];
  long lVar15;
  
  lVar9 = 0;
  while (((ulong)(byte)text[lVar9] < 0x21 &&
         ((0x100002600U >> ((ulong)(byte)text[lVar9] & 0x3f) & 1) != 0))) {
    lVar9 = lVar9 + 1;
  }
  bVar6 = text[lVar9];
  if (bVar6 == 0) {
LAB_0010837e:
    iVar5 = 0;
  }
  else {
    do {
      if (state->status != 1) goto LAB_0010837e;
      uVar7 = 0xffffffff;
      if (bVar6 < 0x7f) {
        uVar7 = (uint)ptls_base64_values[(char)bVar6];
      }
      iVar5 = state->nbc;
      if (uVar7 == 0xffffffff) {
        if ((bVar6 == 0x3d && iVar5 == 2) && (text[lVar9 + 1] == '=')) {
          state->nbc = 4;
          state->nbo = 1;
          state->v = state->v << 0xc;
          lVar9 = lVar9 + 2;
          iVar5 = 0;
          bVar4 = true;
        }
        else {
          if (bVar6 == 0x3d && iVar5 == 3) {
            state->nbc = 4;
            state->nbo = 2;
            state->v = state->v << 6;
            goto LAB_00108046;
          }
          for (; (bVar6 = text[lVar9], bVar6 - 9 < 5 || (bVar6 == 0x20)); lVar9 = lVar9 + 1) {
          }
          if (bVar6 == 0) goto LAB_0010837e;
          state->nbo = 0;
          state->status = -1;
          iVar5 = 0x232;
          bVar4 = false;
        }
      }
      else {
        state->nbc = iVar5 + 1;
        state->v = state->v << 6 | uVar7;
LAB_00108046:
        iVar5 = 0;
        bVar4 = true;
        lVar9 = lVar9 + 1;
      }
      if ((bVar4) && (iVar5 = 0, state->nbc == 4)) {
        iVar5 = state->nbo;
        len = (size_t)iVar5;
        if (0 < (long)len) {
          uVar7 = state->v;
          lVar15 = len - 1;
          auVar11._8_4_ = (int)lVar15;
          auVar11._0_8_ = lVar15;
          auVar11._12_4_ = (int)((ulong)lVar15 >> 0x20);
          bVar6 = 0x98;
          auVar11 = auVar11 ^ _DAT_0012c8f0;
          uVar8 = 0;
          auVar14 = _DAT_0012c8e0;
          auVar16 = _DAT_0012c8d0;
          auVar17 = _DAT_0012c870;
          do {
            auVar18 = auVar14 ^ _DAT_0012c8f0;
            iVar22 = auVar11._0_4_;
            iVar28 = -(uint)(iVar22 < auVar18._0_4_);
            iVar12 = auVar11._4_4_;
            auVar19._4_4_ = -(uint)(iVar12 < auVar18._4_4_);
            iVar27 = auVar11._8_4_;
            iVar31 = -(uint)(iVar27 < auVar18._8_4_);
            iVar13 = auVar11._12_4_;
            auVar19._12_4_ = -(uint)(iVar13 < auVar18._12_4_);
            auVar23._4_4_ = iVar28;
            auVar23._0_4_ = iVar28;
            auVar23._8_4_ = iVar31;
            auVar23._12_4_ = iVar31;
            auVar32 = pshuflw(in_XMM12,auVar23,0xe8);
            auVar26._4_4_ = -(uint)(auVar18._4_4_ == iVar12);
            auVar26._12_4_ = -(uint)(auVar18._12_4_ == iVar13);
            auVar26._0_4_ = auVar26._4_4_;
            auVar26._8_4_ = auVar26._12_4_;
            auVar18 = pshuflw(in_XMM13,auVar26,0xe8);
            in_XMM13 = auVar18 & auVar32;
            auVar19._0_4_ = auVar19._4_4_;
            auVar19._8_4_ = auVar19._12_4_;
            auVar32 = pshuflw(auVar32,auVar19,0xe8);
            auVar18._8_4_ = 0xffffffff;
            auVar18._0_8_ = 0xffffffffffffffff;
            auVar18._12_4_ = 0xffffffff;
            auVar18 = (auVar32 | in_XMM13) ^ auVar18;
            in_XMM12 = packssdw(auVar18,auVar18);
            if ((in_XMM12 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              local_33[uVar8] = (char)(uVar7 >> (bVar6 + 0x78 & 0x1f));
            }
            auVar19 = auVar26 & auVar23 | auVar19;
            auVar18 = packssdw(auVar19,auVar19);
            auVar32._8_4_ = 0xffffffff;
            auVar32._0_8_ = 0xffffffffffffffff;
            auVar32._12_4_ = 0xffffffff;
            auVar18 = packssdw(auVar18 ^ auVar32,auVar18 ^ auVar32);
            auVar18 = packsswb(auVar18,auVar18);
            if ((auVar18._0_4_ >> 8 & 1) != 0) {
              local_33[uVar8 + 1] = (char)(uVar7 >> (bVar6 + 0x70 & 0x1f));
            }
            auVar18 = auVar16 ^ _DAT_0012c8f0;
            iVar28 = -(uint)(iVar22 < auVar18._0_4_);
            auVar24._4_4_ = -(uint)(iVar12 < auVar18._4_4_);
            iVar31 = -(uint)(iVar27 < auVar18._8_4_);
            auVar24._12_4_ = -(uint)(iVar13 < auVar18._12_4_);
            auVar29._4_4_ = iVar28;
            auVar29._0_4_ = iVar28;
            auVar29._8_4_ = iVar31;
            auVar29._12_4_ = iVar31;
            auVar20._4_4_ = -(uint)(auVar18._4_4_ == iVar12);
            auVar20._12_4_ = -(uint)(auVar18._12_4_ == iVar13);
            auVar20._0_4_ = auVar20._4_4_;
            auVar20._8_4_ = auVar20._12_4_;
            auVar24._0_4_ = auVar24._4_4_;
            auVar24._8_4_ = auVar24._12_4_;
            auVar18 = packssdw(auVar20 & auVar29,auVar24 | auVar20 & auVar29);
            auVar2._8_4_ = 0xffffffff;
            auVar2._0_8_ = 0xffffffffffffffff;
            auVar2._12_4_ = 0xffffffff;
            auVar18 = packssdw(auVar18 ^ auVar2,auVar18 ^ auVar2);
            auVar18 = packsswb(auVar18,auVar18);
            if ((auVar18._0_4_ >> 0x10 & 1) != 0) {
              local_33[uVar8 + 2] = (char)uVar7;
            }
            auVar18 = auVar17 ^ _DAT_0012c8f0;
            iVar22 = -(uint)(iVar22 < auVar18._0_4_);
            auVar25._4_4_ = -(uint)(iVar12 < auVar18._4_4_);
            iVar27 = -(uint)(iVar27 < auVar18._8_4_);
            auVar25._12_4_ = -(uint)(iVar13 < auVar18._12_4_);
            auVar30._4_4_ = iVar22;
            auVar30._0_4_ = iVar22;
            auVar30._8_4_ = iVar27;
            auVar30._12_4_ = iVar27;
            auVar19 = pshufhw(auVar30,auVar30,0x84);
            auVar21._4_4_ = -(uint)(auVar18._4_4_ == iVar12);
            auVar21._12_4_ = -(uint)(auVar18._12_4_ == iVar13);
            auVar21._0_4_ = auVar21._4_4_;
            auVar21._8_4_ = auVar21._12_4_;
            auVar18 = pshufhw(auVar21,auVar21,0x84);
            auVar25._0_4_ = auVar25._4_4_;
            auVar25._8_4_ = auVar25._12_4_;
            auVar26 = pshufhw(auVar25,auVar25,0x84);
            auVar3._8_4_ = 0xffffffff;
            auVar3._0_8_ = 0xffffffffffffffff;
            auVar3._12_4_ = 0xffffffff;
            auVar18 = packssdw(auVar18 & auVar19,(auVar26 | auVar18 & auVar19) ^ auVar3);
            auVar18 = packsswb(auVar18,auVar18);
            if ((auVar18._14_2_ >> 8 & 1) != 0) {
              (&stack0xffffffffffffffdc)[uVar8] = (char)(uVar7 >> (bVar6 & 0x1f));
            }
            uVar8 = uVar8 + 0x10;
            lVar15 = auVar14._8_8_;
            auVar14._0_8_ = auVar14._0_8_ + 0x10;
            auVar14._8_8_ = lVar15 + 0x10;
            lVar15 = auVar16._8_8_;
            auVar16._0_8_ = auVar16._0_8_ + 0x10;
            auVar16._8_8_ = lVar15 + 0x10;
            lVar15 = auVar17._8_8_;
            auVar17._0_8_ = auVar17._0_8_ + 0x10;
            auVar17._8_8_ = lVar15 + 0x10;
            bVar6 = bVar6 + 0x80;
          } while ((iVar5 + 0xfU & 0xfffffff0) != uVar8);
        }
        iVar5 = ptls_buffer__do_pushv(buf,local_33,len);
        if (iVar5 != 0) goto LAB_001082be;
        if (2 < state->nbo) {
          state->v = 0;
          state->nbc = 0;
          state->nbo = 3;
          iVar5 = 0;
          goto LAB_001082be;
        }
        pcVar10 = text + lVar9;
        do {
          cVar1 = *pcVar10;
          pcVar10 = pcVar10 + 1;
        } while (cVar1 != '\0');
        state->status = 0;
        goto LAB_0010837e;
      }
LAB_001082be:
    } while ((iVar5 == 0) && (bVar6 = text[lVar9], bVar6 != 0));
  }
  return iVar5;
}

Assistant:

int ptls_base64_decode(const char *text, ptls_base64_decode_state_t *state, ptls_buffer_t *buf)
{
    int ret = 0;
    uint8_t decoded[3];
    size_t text_index = 0;
    int c;
    signed char vc;

    /* skip initial blanks */
    while (text[text_index] != 0) {
        c = text[text_index];

        if (c == ' ' || c == '\t' || c == '\r' || c == '\n') {
            text_index++;
        } else {
            break;
        }
    }

    while (text[text_index] != 0 && ret == 0 && state->status == PTLS_BASE64_DECODE_IN_PROGRESS) {
        c = text[text_index++];

        vc = 0 < c && c < 0x7f ? ptls_base64_values[c] : -1;
        if (vc == -1) {
            if (state->nbc == 2 && c == '=' && text[text_index] == '=') {
                state->nbc = 4;
                text_index++;
                state->nbo = 1;
                state->v <<= 12;
            } else if (state->nbc == 3 && c == '=') {
                state->nbc = 4;
                state->nbo = 2;
                state->v <<= 6;
            } else {
                /* Skip final blanks */
                for (--text_index; text[text_index] != 0; ++text_index) {
                    c = text[text_index];
                    if (!(c == ' ' || c == '\t' || c == '\r' || c == '\n' || c == 0x0B || c == 0x0C))
                        break;
                }

                /* Should now be at end of buffer */
                if (text[text_index] == 0) {
                    break;
                } else {
                    /* Not at end of buffer, signal a decoding error */
                    state->nbo = 0;
                    state->status = PTLS_BASE64_DECODE_FAILED;
                    ret = PTLS_ERROR_INCORRECT_BASE64;
                }
            }
        } else {
            state->nbc++;
            state->v <<= 6;
            state->v |= vc;
        }

        if (ret == 0 && state->nbc == 4) {
            /* Convert to up to 3 octets */
            for (int j = 0; j < state->nbo; j++) {
                decoded[j] = (uint8_t)(state->v >> (8 * (2 - j)));
            }

            ret = ptls_buffer__do_pushv(buf, decoded, state->nbo);

            if (ret == 0) {
                /* test for fin or continuation */
                if (state->nbo < 3) {
                    /* Check that there are only trainling blanks on this line */
                    while (text[text_index] != 0) {
                        c = text[text_index++];

                        if (c == ' ' || c == '\t' || c == '\r' || c == '\n' || c == 0x0B || c == 0x0C) {
                            continue;
                        }
                    }
                    if (text[text_index] == 0) {
                        state->status = PTLS_BASE64_DECODE_DONE;
                    } else {
                        state->status = PTLS_BASE64_DECODE_FAILED;
                        ret = PTLS_ERROR_INCORRECT_BASE64;
                    }
                    break;
                } else {
                    state->v = 0;
                    state->nbo = 3;
                    state->nbc = 0;
                }
            }
        }
    }
    return ret;
}